

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::QMdiArea(QMdiArea *this,QWidget *parent)

{
  QMdiAreaPrivate *this_00;
  QPalette *this_01;
  QBrush *brush;
  
  this_00 = (QMdiAreaPrivate *)operator_new(1000);
  QMdiAreaPrivate::QMdiAreaPrivate(this_00);
  QAbstractScrollArea::QAbstractScrollArea
            ((QAbstractScrollArea *)this,(QAbstractScrollAreaPrivate *)this_00,parent);
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       &PTR_metaObject_007cf840;
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QMdiArea_007cfa18;
  this_01 = QWidget::palette((QWidget *)this);
  brush = QPalette::brush(this_01,Dark);
  setBackground(this,brush);
  QFrame::setFrameStyle((QFrame *)this,0);
  QAbstractScrollArea::setHorizontalScrollBarPolicy((QAbstractScrollArea *)this,ScrollBarAlwaysOff);
  QAbstractScrollArea::setVerticalScrollBarPolicy((QAbstractScrollArea *)this,ScrollBarAlwaysOff);
  QAbstractScrollArea::setViewport((QAbstractScrollArea *)this,(QWidget *)0x0);
  QWidget::setFocusPolicy((QWidget *)this,NoFocus);
  QObject::installEventFilter(QCoreApplication::self);
  return;
}

Assistant:

QMdiArea::QMdiArea(QWidget *parent)
    : QAbstractScrollArea(*new QMdiAreaPrivate, parent)
{
    setBackground(palette().brush(QPalette::Dark));
    setFrameStyle(QFrame::NoFrame);
    setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    setViewport(nullptr);
    setFocusPolicy(Qt::NoFocus);
    QApplication::instance()->installEventFilter(this);
}